

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall Bstrlib::CBString::alloc(CBString *this,int len)

{
  int iVar1;
  CBStringException *this_00;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  CBStringException bstr__cppwrapper_exception;
  int len_local;
  CBString *this_local;
  
  bstr__cppwrapper_exception.msg.field_2._12_4_ = len;
  iVar1 = balloc(&this->super_tagbstring,len);
  if (iVar1 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,"CBString::Failure in alloc",&local_61);
    CBStringException::CBStringException((CBStringException *)local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(this_00,(CBStringException *)local_40);
    __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  return;
}

Assistant:

void CBString::alloc (int len) {
	if (BSTR_ERR == balloc ((bstring)this, len)) {
		bstringThrow ("Failure in alloc");
	}
}